

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O1

void __thiscall Minefield::unflag(Minefield *this,int x,int y)

{
  long lVar1;
  ulong uVar2;
  runtime_error *this_00;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  checkPos(this,x,y);
  checkRunning(this);
  checkPos(this,x,y);
  uVar3 = (ulong)y;
  uVar2 = uVar3 + 0x3f;
  if (-1 < (long)uVar3) {
    uVar2 = uVar3;
  }
  lVar5 = ((long)uVar2 >> 6) * 8;
  uVar2 = (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001);
  uVar4 = 1L << ((byte)y & 0x3f);
  if ((*(ulong *)(*(long *)&(this->opened).
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[x].
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data + lVar5 + -8 + uVar2 * 8) >> (uVar3 & 0x3f) & 1
      ) == 0) {
    lVar1 = uVar2 * 8 + -8;
    checkPos(this,x,y);
    lVar5 = lVar5 + *(long *)&(this->flags).
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[x].
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data;
    uVar2 = *(ulong *)(lVar1 + lVar5);
    if ((uVar2 & uVar4) != 0) {
      *(ulong *)(lVar5 + lVar1) = uVar2 & ~uVar4;
      this->flag_cnt = this->flag_cnt + -1;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t remove flag on opened field.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Minefield::unflag(int x, int y) {
    checkPos(x, y);
    checkRunning();

    if (isOpen(x, y)) {
        throw std::runtime_error("Can't remove flag on opened field.");
    }

    if (isFlagged(x, y)) {
        flags[x][y] = false;
        flag_cnt--;
    }
}